

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void Service_Browse_single
               (UA_Server *server,UA_Session *session,ContinuationPointEntry *cp,
               UA_BrowseDescription *descr,UA_UInt32 maxrefs,UA_BrowseResult *result)

{
  uint uVar1;
  UA_NodeStore *ns;
  ContinuationPointEntry *pCVar2;
  size_t sVar3;
  ulong uVar4;
  UA_Boolean UVar5;
  UA_StatusCode UVar6;
  UA_StatusCode UVar7;
  uint uVar8;
  ulong uVar9;
  UA_ReferenceDescription *pUVar10;
  long lVar11;
  UA_Node *src;
  long lVar12;
  UA_Node *pUVar13;
  ContinuationPointEntry *pCVar14;
  UA_Guid *pUVar15;
  ulong uVar16;
  long lVar17;
  UA_ReferenceNode *n1;
  UA_NodeId *pUVar18;
  ulong size;
  size_t sVar19;
  long lVar20;
  size_t sVar21;
  UA_Guid UVar22;
  ulong local_a0;
  size_t local_70;
  size_t relevant_refs_size;
  UA_NodeId *relevant_refs;
  UA_UInt32 local_54;
  UA_BrowseDescription *local_50;
  ulong local_48;
  UA_Node *local_40;
  char local_31;
  
  if (cp == (ContinuationPointEntry *)0x0) {
    uVar9 = 0;
  }
  else {
    descr = &cp->browseDescription;
    uVar9 = (ulong)cp->continuationIndex;
    maxrefs = cp->maxReferences;
  }
  if (UA_BROWSEDIRECTION_BOTH < descr->browseDirection) {
    result->statusCode = 0x804d0000;
    return;
  }
  local_70 = 0;
  relevant_refs_size = 0;
  pUVar18 = &descr->referenceTypeId;
  local_54 = maxrefs;
  local_31 = UA_NodeId_isNull(pUVar18);
  if (!(bool)local_31) {
    ns = server->nodestore;
    pUVar13 = UA_NodeStore_get(ns,pUVar18);
    if ((pUVar13 == (UA_Node *)0x0) || (pUVar13->nodeClass != UA_NODECLASS_REFERENCETYPE)) {
      result->statusCode = 0x804c0000;
      return;
    }
    if (descr->includeSubtypes == true) {
      UVar6 = getTypeHierarchy(ns,pUVar13,false,(UA_NodeId **)&relevant_refs_size,&local_70);
      result->statusCode = UVar6;
      if (UVar6 != 0) {
        return;
      }
    }
    else {
      local_70 = 1;
      relevant_refs_size = (size_t)pUVar18;
    }
  }
  local_40 = UA_NodeStore_get(server->nodestore,&descr->nodeId);
  if (local_40 == (UA_Node *)0x0) {
    result->statusCode = 0x80340000;
LAB_0011f669:
    if ((local_31 == '\0') && (descr->includeSubtypes == true)) {
      UA_Array_delete((void *)relevant_refs_size,local_70,UA_TYPES + 0x10);
    }
    return;
  }
  sVar19 = local_40->referencesSize;
  if (sVar19 == 0) {
    result->referencesSize = 0;
    goto LAB_0011f669;
  }
  uVar16 = (ulong)local_54;
  size = uVar16;
  if (sVar19 < uVar16) {
    size = sVar19;
  }
  if (local_54 == 0) {
    size = sVar19;
  }
  pUVar10 = (UA_ReferenceDescription *)UA_Array_new(size,UA_TYPES + 0x76);
  sVar3 = relevant_refs_size;
  result->references = pUVar10;
  if (pUVar10 == (UA_ReferenceDescription *)0x0) {
    uVar8 = 0x80030000;
    sVar21 = 0;
    local_48 = 0;
  }
  else {
    uVar8 = 0;
    lVar11 = local_70 + 1;
    sVar21 = 0;
    local_a0 = 0;
    local_48 = 0;
    pUVar13 = local_40;
    local_50 = descr;
    while ((sVar21 < sVar19 && (local_48 < size))) {
      if (pUVar13->references[sVar21].isInverse == true) {
        if (descr->browseDirection != UA_BROWSEDIRECTION_FORWARD) {
LAB_0011f3d1:
          n1 = pUVar13->references + sVar21;
          pUVar18 = (UA_NodeId *)sVar3;
          lVar20 = lVar11;
          if (local_31 == '\0') {
            do {
              pUVar13 = local_40;
              descr = local_50;
              if (lVar20 + -1 == 0) goto LAB_0011f590;
              UVar5 = UA_NodeId_equal(&n1->referenceTypeId,pUVar18);
              pUVar18 = pUVar18 + 1;
              lVar20 = lVar20 + -1;
            } while (!UVar5);
          }
          src = UA_NodeStore_get(server->nodestore,&(n1->targetId).nodeId);
          uVar4 = local_48;
          pUVar13 = local_40;
          descr = local_50;
          if ((src != (UA_Node *)0x0) &&
             ((local_50->nodeClassMask == UA_NODECLASS_UNSPECIFIED ||
              ((src->nodeClass & local_50->nodeClassMask) != UA_NODECLASS_UNSPECIFIED)))) {
            if (local_a0 < uVar9) {
              local_a0 = local_a0 + 1;
            }
            else {
              uVar1 = local_50->resultMask;
              pUVar10 = result->references;
              relevant_refs = &pUVar10[local_48].referenceTypeId;
              memset(relevant_refs,0,0xc0);
              UVar6 = UA_NodeId_copy(&src->nodeId,&pUVar10[uVar4].nodeId.nodeId);
              if ((uVar1 & 1) != 0) {
                UVar7 = UA_NodeId_copy(&n1->referenceTypeId,relevant_refs);
                UVar6 = UVar6 | UVar7;
              }
              if ((uVar1 & 2) != 0) {
                *(byte *)&relevant_refs[1].namespaceIndex = n1->isInverse ^ 1;
              }
              if ((uVar1 & 4) != 0) {
                *(UA_NodeClass *)((long)&relevant_refs[5].identifier + 8) = src->nodeClass;
              }
              if ((uVar1 & 8) != 0) {
                UVar7 = UA_QualifiedName_copy
                                  (&src->browseName,
                                   (UA_QualifiedName *)&relevant_refs[3].identifier.string);
                UVar6 = UVar6 | UVar7;
              }
              if ((uVar1 & 0x10) != 0) {
                UVar7 = UA_LocalizedText_copy
                                  (&src->displayName,
                                   (UA_LocalizedText *)&relevant_refs[4].identifier.string);
                UVar6 = UVar6 | UVar7;
              }
              if (((uVar1 & 0x20) != 0) && (src->nodeClass - UA_NODECLASS_OBJECT < 2)) {
                lVar12 = src->referencesSize + 1;
                lVar20 = -0x30;
                do {
                  lVar17 = lVar20;
                  lVar12 = lVar12 + -1;
                  if (lVar12 == 0) goto LAB_0011f576;
                  lVar20 = lVar17 + 0x50;
                } while (*(int *)((long)&(src->references->targetId).namespaceUri.length + lVar17)
                         != 0x28);
                UVar7 = UA_ExpandedNodeId_copy
                                  ((UA_ExpandedNodeId *)
                                   ((long)&src->references[1].referenceTypeId.namespaceIndex +
                                   lVar17),(UA_ExpandedNodeId *)(relevant_refs + 6));
                UVar6 = UVar6 | UVar7;
              }
LAB_0011f576:
              uVar8 = uVar8 | UVar6;
              local_48 = local_48 + 1;
              sVar19 = local_40->referencesSize;
              pUVar13 = local_40;
              descr = local_50;
            }
          }
        }
      }
      else if (descr->browseDirection != UA_BROWSEDIRECTION_INVERSE) goto LAB_0011f3d1;
LAB_0011f590:
      sVar21 = sVar21 + 1;
    }
    result->referencesSize = local_48;
    if (local_48 == 0) {
      free(result->references);
      result->referencesSize = 0;
      result->references = (UA_ReferenceDescription *)0x0;
      pUVar13 = local_40;
    }
    if (uVar8 == 0) goto LAB_0011f6ae;
    UA_Array_delete(result->references,local_48,UA_TYPES + 0x76);
    result->referencesSize = 0;
    result->references = (UA_ReferenceDescription *)0x0;
  }
  result->statusCode = uVar8;
  pUVar13 = local_40;
LAB_0011f6ae:
  if ((local_31 == '\0') && (descr->includeSubtypes == true)) {
    UA_Array_delete((void *)relevant_refs_size,local_70,UA_TYPES + 0x10);
    pUVar13 = local_40;
  }
  if (result->statusCode != 0) {
    return;
  }
  if (cp != (ContinuationPointEntry *)0x0) {
    if (sVar21 == pUVar13->referencesSize) {
      removeCp(cp,session);
      return;
    }
    cp->continuationIndex = cp->continuationIndex + (int)local_48;
    UA_ByteString_copy(&cp->identifier,&result->continuationPoint);
    return;
  }
  if (local_48 < uVar16 || local_54 == 0) {
    return;
  }
  if ((session->availableContinuationPoints != 0) &&
     (pCVar14 = (ContinuationPointEntry *)malloc(0x70), pCVar14 != (ContinuationPointEntry *)0x0)) {
    UA_copy(descr,&pCVar14->browseDescription,UA_TYPES + 0x6c);
    pCVar14->maxReferences = local_54;
    pCVar14->continuationIndex = (UA_UInt32)local_48;
    pUVar15 = (UA_Guid *)UA_new(UA_TYPES + 0xd);
    UVar22 = UA_Guid_random();
    *pUVar15 = UVar22;
    (pCVar14->identifier).data = (UA_Byte *)pUVar15;
    (pCVar14->identifier).length = 0x10;
    UA_ByteString_copy(&pCVar14->identifier,&result->continuationPoint);
    pCVar2 = (session->continuationPoints).lh_first;
    (pCVar14->pointers).le_next = pCVar2;
    if (pCVar2 != (ContinuationPointEntry *)0x0) {
      (pCVar2->pointers).le_prev = (ContinuationPointEntry **)pCVar14;
    }
    (session->continuationPoints).lh_first = pCVar14;
    (pCVar14->pointers).le_prev = &(session->continuationPoints).lh_first;
    session->availableContinuationPoints = session->availableContinuationPoints - 1;
    return;
  }
  result->statusCode = 0x804b0000;
  return;
}

Assistant:

void
Service_Browse_single(UA_Server *server, UA_Session *session,
                      struct ContinuationPointEntry *cp, const UA_BrowseDescription *descr,
                      UA_UInt32 maxrefs, UA_BrowseResult *result) { 
    size_t referencesCount = 0;
    size_t referencesIndex = 0;
    /* set the browsedescription if a cp is given */
    UA_UInt32 continuationIndex = 0;
    if(cp) {
        descr = &cp->browseDescription;
        maxrefs = cp->maxReferences;
        continuationIndex = cp->continuationIndex;
    }

    /* is the browsedirection valid? */
    if(descr->browseDirection != UA_BROWSEDIRECTION_BOTH &&
       descr->browseDirection != UA_BROWSEDIRECTION_FORWARD &&
       descr->browseDirection != UA_BROWSEDIRECTION_INVERSE) {
        result->statusCode = UA_STATUSCODE_BADBROWSEDIRECTIONINVALID;
        return;
    }
    
    /* get the references that match the browsedescription */
    size_t relevant_refs_size = 0;
    UA_NodeId *relevant_refs = NULL;
    UA_Boolean all_refs = UA_NodeId_isNull(&descr->referenceTypeId);
    if(!all_refs) {
        const UA_Node *rootRef = UA_NodeStore_get(server->nodestore, &descr->referenceTypeId);
        if(!rootRef || rootRef->nodeClass != UA_NODECLASS_REFERENCETYPE) {
            result->statusCode = UA_STATUSCODE_BADREFERENCETYPEIDINVALID;
            return;
        }
        if(descr->includeSubtypes) {
            result->statusCode = getTypeHierarchy(server->nodestore, rootRef, false,
                                                  &relevant_refs, &relevant_refs_size);
            if(result->statusCode != UA_STATUSCODE_GOOD)
                return;
        } else {
            relevant_refs = (UA_NodeId*)(uintptr_t)&descr->referenceTypeId;
            relevant_refs_size = 1;
        }
    }

    /* get the node */
    const UA_Node *node = UA_NodeStore_get(server->nodestore, &descr->nodeId);
    if(!node) {
        result->statusCode = UA_STATUSCODE_BADNODEIDUNKNOWN;
        if(!all_refs && descr->includeSubtypes)
            UA_Array_delete(relevant_refs, relevant_refs_size, &UA_TYPES[UA_TYPES_NODEID]);
        return;
    }

    /* if the node has no references, just return */
    if(node->referencesSize == 0) {
        result->referencesSize = 0;
        if(!all_refs && descr->includeSubtypes)
            UA_Array_delete(relevant_refs, relevant_refs_size, &UA_TYPES[UA_TYPES_NODEID]);
        return;
    }

    /* how many references can we return at most? */
    size_t real_maxrefs = maxrefs;
    if(real_maxrefs == 0)
        real_maxrefs = node->referencesSize;
    else if(real_maxrefs > node->referencesSize)
        real_maxrefs = node->referencesSize;
    result->references = UA_Array_new(real_maxrefs, &UA_TYPES[UA_TYPES_REFERENCEDESCRIPTION]);
    if(!result->references) {
        result->statusCode = UA_STATUSCODE_BADOUTOFMEMORY;
        goto cleanup;
    }

    /* loop over the node's references */
    size_t skipped = 0;
    UA_Boolean isExternal = false;
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    for(; referencesIndex < node->referencesSize && referencesCount < real_maxrefs; ++referencesIndex) {
        isExternal = false;
        const UA_Node *current =
            returnRelevantNode(server, descr, all_refs, &node->references[referencesIndex],
                               relevant_refs, relevant_refs_size, &isExternal);
        if(!current)
            continue;

        if(skipped < continuationIndex) {
            ++skipped;
        } else {
            retval |= fillReferenceDescription(server->nodestore, current,
                                               &node->references[referencesIndex],
                                               descr->resultMask,
                                               &result->references[referencesCount]);
            ++referencesCount;
        }
    }
    result->referencesSize = referencesCount;

    if(referencesCount == 0) {
        UA_free(result->references);
        result->references = NULL;
        result->referencesSize = 0;
    }

    if(retval != UA_STATUSCODE_GOOD) {
        UA_Array_delete(result->references, result->referencesSize,
                        &UA_TYPES[UA_TYPES_REFERENCEDESCRIPTION]);
        result->references = NULL;
        result->referencesSize = 0;
        result->statusCode = retval;
    }

 cleanup:
    if(!all_refs && descr->includeSubtypes)
        UA_Array_delete(relevant_refs, relevant_refs_size, &UA_TYPES[UA_TYPES_NODEID]);
    if(result->statusCode != UA_STATUSCODE_GOOD)
        return;

    /* create, update, delete continuation points */
    if(cp) {
        if(referencesIndex == node->referencesSize) {
            /* all done, remove a finished continuationPoint */
            removeCp(cp, session);
        } else {
            /* update the cp and return the cp identifier */
            cp->continuationIndex += (UA_UInt32)referencesCount;
            UA_ByteString_copy(&cp->identifier, &result->continuationPoint);
        }
    } else if(maxrefs != 0 && referencesCount >= maxrefs) {
        /* create a cp */
        if(session->availableContinuationPoints <= 0 ||
           !(cp = UA_malloc(sizeof(struct ContinuationPointEntry)))) {
            result->statusCode = UA_STATUSCODE_BADNOCONTINUATIONPOINTS;
            return;
        }
        UA_BrowseDescription_copy(descr, &cp->browseDescription);
        cp->maxReferences = maxrefs;
        cp->continuationIndex = (UA_UInt32)referencesCount;
        UA_Guid *ident = UA_Guid_new();
        *ident = UA_Guid_random();
        cp->identifier.data = (UA_Byte*)ident;
        cp->identifier.length = sizeof(UA_Guid);
        UA_ByteString_copy(&cp->identifier, &result->continuationPoint);

        /* store the cp */
        LIST_INSERT_HEAD(&session->continuationPoints, cp, pointers);
        --session->availableContinuationPoints;
    }
}